

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runlength.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *filename;
  int iVar1;
  FILE *__stream;
  FILE *__stream_00;
  void *__buf;
  ostream *poVar2;
  FILE *__n;
  Pl_RunLength rl;
  Pl_StdioFile out;
  uchar buf [100];
  
  if (argc != 4) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Usage: runlength {-encode|-decode} infile outfile");
    std::endl<char,std::char_traits<char>>(poVar2);
    exit(2);
  }
  iVar1 = strcmp("-encode",argv[1]);
  filename = argv[3];
  __stream = (FILE *)QUtil::safe_fopen(argv[2],"rb");
  __stream_00 = (FILE *)QUtil::safe_fopen(filename,"wb");
  Pl_StdioFile::Pl_StdioFile(&out,"stdout",(FILE *)__stream_00);
  Pl_RunLength::Pl_RunLength(&rl,"runlength",&out.super_Pipeline,(uint)(iVar1 != 0));
  do {
    __n = __stream;
    __buf = (void *)fread(buf,1,100,__stream);
    if (__buf == (void *)0x0) break;
    Pl_RunLength::write(&rl,(int)buf,__buf,(size_t)__n);
  } while (__buf != (void *)0x0);
  Pl_RunLength::finish(&rl);
  fclose(__stream);
  fclose(__stream_00);
  Pl_RunLength::~Pl_RunLength(&rl);
  Pl_StdioFile::~Pl_StdioFile(&out);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    if (argc != 4) {
        std::cerr << "Usage: runlength {-encode|-decode} infile outfile" << std::endl;
        exit(2);
    }

    bool encode = (strcmp("-encode", argv[1]) == 0);
    char* infilename = argv[2];
    char* outfilename = argv[3];

    FILE* infile = QUtil::safe_fopen(infilename, "rb");
    FILE* outfile = QUtil::safe_fopen(outfilename, "wb");
    Pl_StdioFile out("stdout", outfile);
    unsigned char buf[100];
    bool done = false;
    Pl_RunLength rl("runlength", &out, (encode ? Pl_RunLength::a_encode : Pl_RunLength::a_decode));
    while (!done) {
        size_t len = fread(buf, 1, sizeof(buf), infile);
        if (len <= 0) {
            done = true;
        } else {
            rl.write(buf, len);
        }
    }
    rl.finish();
    fclose(infile);
    fclose(outfile);
    return 0;
}